

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O0

int thread_pool_init(thread_pool_t *pool,size_t num_threads)

{
  int iVar1;
  jobqueue *pjVar2;
  thread **pptVar3;
  ulong uStack_28;
  int id;
  size_t i;
  size_t num_threads_local;
  thread_pool_t *pool_local;
  
  if (pool == (thread_pool_t *)0x0) {
    fprintf(_stderr,"thread_pool_init(): thread_pool is a null pointer.\n");
    pool_local._4_4_ = -1;
  }
  else {
    pool->keepAlive = 1;
    pool->num_threads_alive = 0;
    pool->num_threads_working = 0;
    pjVar2 = (jobqueue *)malloc(0x48);
    pool->jobqueue = pjVar2;
    if (pool->jobqueue == (jobqueue *)0x0) {
      fprintf(_stderr,"jobqueue_init(): Malloc failed for job queue.\n");
      pool_local._4_4_ = -1;
    }
    else {
      iVar1 = jobqueue_init(pool->jobqueue);
      if (iVar1 == -1) {
        fprintf(_stderr,"thread_pool_init(): Initialising job queue failed.\n");
        pool_local._4_4_ = -1;
      }
      else {
        pptVar3 = (thread **)malloc(num_threads << 3);
        pool->threads = pptVar3;
        if (pool->threads == (thread **)0x0) {
          fprintf(_stderr,"thread_pool_init(): Malloc failed for creating threads\n");
          jobqueue_destroy(pool->jobqueue);
          free(pool);
          pool_local._4_4_ = -1;
        }
        else {
          iVar1 = pthread_mutex_init((pthread_mutex_t *)&pool->thcount_lock,
                                     (pthread_mutexattr_t *)0x0);
          if (iVar1 == 0) {
            iVar1 = pthread_cond_init((pthread_cond_t *)&pool->threads_idle,
                                      (pthread_condattr_t *)0x0);
            if (iVar1 == 0) {
              set_sig_handler();
              for (uStack_28 = 0; uStack_28 < num_threads; uStack_28 = uStack_28 + 1) {
                thread_init(pool,pool->threads + uStack_28);
              }
              while (pool->num_threads_alive != num_threads) {
                usleep(100000);
              }
              iVar1 = vector_add(&vec,pool);
              pool->id = iVar1;
              pool_local._4_4_ = 0;
            }
            else {
              fprintf(_stderr,"thread_pool_init(): condition initialisation failed.\n");
              pool_local._4_4_ = -1;
            }
          }
          else {
            fprintf(_stderr,"thread_pool_init(): mutex initialisation failed.\n");
            jobqueue_destroy(pool->jobqueue);
            free(pool->threads);
            free(pool);
            pool_local._4_4_ = -1;
          }
        }
      }
    }
  }
  return pool_local._4_4_;
}

Assistant:

int thread_pool_init(thread_pool_t *pool, size_t num_threads) {
    if (pool == NULL) {
        err("thread_pool_init(): thread_pool is a null pointer.\n");
        return -1;
    }

    pool->keepAlive = 1;
    pool->num_threads_alive = 0;
    pool->num_threads_working = 0;

    /* ThreadPool should have a job queue */
    pool->jobqueue = malloc(sizeof(struct jobqueue));

    if (pool->jobqueue == NULL) {
        err("jobqueue_init(): Malloc failed for job queue.\n");
        return -1;
    }

    if (jobqueue_init(pool->jobqueue) == -1) {
        err("thread_pool_init(): Initialising job queue failed.\n");
        return -1;
    }

    /* Creating the threads in the thread pool */
    pool->threads = malloc(num_threads * sizeof(struct thread *));
    if (pool->threads == NULL) {
        err("thread_pool_init(): Malloc failed for creating threads\n");
        jobqueue_destroy(pool->jobqueue);
        free(pool);
        return -1;
    }

    /* Initialise mutex and condition in thread pool */
    if (pthread_mutex_init(&pool->thcount_lock, 0)) {
        err("thread_pool_init(): mutex initialisation failed.\n");
        jobqueue_destroy(pool->jobqueue);
        free(pool->threads);
        free(pool);
        return -1;
    }

    if (pthread_cond_init(&pool->threads_idle, 0) != 0) {
        err("thread_pool_init(): condition initialisation failed.\n");
        return -1;
    }

    set_sig_handler();

    for (size_t i = 0; i < num_threads; ++i) {
        thread_init(pool, &pool->threads[i]);
    }

    /* Waiting to all threads to be initialised */
    while (pool->num_threads_alive != num_threads) {
        usleep(100 * 1000);
    }

    int id = vector_add(&vec, pool);

    /* Id is the index of the pool in the vector of the pools. */
    pool->id = id;

    return 0;
}